

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O3

string * __thiscall
adios2::format::BP4Base::GetBPSubStreamName
          (string *__return_storage_ptr__,BP4Base *this,string *name,size_t id,bool hasSubFiles,
          bool isReader)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  undefined8 uVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  undefined7 in_register_00000081;
  string __str;
  string bpName;
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  string local_50;
  
  if ((int)CONCAT71(in_register_00000081,hasSubFiles) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + name->_M_string_length);
    return __return_storage_ptr__;
  }
  helper::RemoveTrailingSlash(&local_50,name);
  if ((!isReader) && ((&this->field_0x329)[(long)this->_vptr_BP4Base[-3]] == '\x01')) {
    id = *(size_t *)(&this->field_0x308 + (long)this->_vptr_BP4Base[-3]);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_80 = *puVar8;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar8;
    local_90 = (ulong *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar10 = '\x01';
  if (9 < id) {
    uVar9 = id;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (uVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0056f03e;
      }
      if (uVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0056f03e;
      }
      if (uVar9 < 10000) goto LAB_0056f03e;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_0056f03e:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,id);
  uVar9 = CONCAT44(uStack_a4,local_a8) + local_88;
  uVar11 = 0xf;
  if (local_90 != &local_80) {
    uVar11 = local_80;
  }
  if (uVar11 < uVar9) {
    uVar11 = 0xf;
    if (local_b0 != local_a0) {
      uVar11 = local_a0[0];
    }
    if (uVar9 <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_0056f0c0;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_0056f0c0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar4 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BP4Base::GetBPSubStreamName(const std::string &name, const size_t id,
                                        const bool hasSubFiles, const bool isReader) const noexcept
{
    if (!hasSubFiles)
    {
        return name;
    }

    const std::string bpName = helper::RemoveTrailingSlash(name);

    const size_t index = isReader                  ? id
                         : m_Aggregator.m_IsActive ? m_Aggregator.m_SubStreamIndex
                                                   : id;

    /* the name of a data file starts with "data." */
    const std::string bpRankName(bpName + PathSeparator + "data." + std::to_string(index));
    return bpRankName;
}